

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof2.h
# Opt level: O0

void Prf_ManChainResolve(Prf_Man_t *p,clause *c)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  word *pwVar4;
  int local_28;
  int local_24;
  int Entry;
  int w;
  word *pProofStart;
  clause *c_local;
  Prf_Man_t *p_local;
  
  if (p->iFirst < 0) {
    __assert_fail("p->iFirst >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                  ,0xe0,"void Prf_ManChainResolve(Prf_Man_t *, clause *)");
  }
  if (p->pInfo == (word *)0x0) {
    __assert_fail("p->pInfo != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                  ,0xe1,"void Prf_ManChainResolve(Prf_Man_t *, clause *)");
  }
  if (((uint)*c & 1) == 0) {
    iVar1 = clause_id(c);
    if (-1 < iVar1) {
      if (p->vId2Pr == (Vec_Int_t *)0x0) {
        local_28 = clause_id(c);
      }
      else {
        p_00 = p->vId2Pr;
        iVar1 = clause_id(c);
        local_28 = Vec_IntEntry(p_00,iVar1);
      }
      if (-1 < local_28) {
        if (p->nWords * 0x40 <= local_28) {
          __assert_fail("Entry < 64 * p->nWords",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                        ,0xfb,"void Prf_ManChainResolve(Prf_Man_t *, clause *)");
        }
        Abc_InfoSetBit((uint *)p->pInfo,local_28);
      }
    }
  }
  else {
    iVar1 = clause_id(c);
    if (p->iFirst <= iVar1) {
      iVar1 = clause_id(c);
      if (iVar1 - p->iFirst < 0) {
        __assert_fail("clause_id(c) - p->iFirst >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                      ,0xe9,"void Prf_ManChainResolve(Prf_Man_t *, clause *)");
      }
      iVar2 = clause_id(c);
      iVar1 = p->iFirst;
      iVar3 = Prf_ManSize(p);
      if (iVar3 <= iVar2 - iVar1) {
        __assert_fail("clause_id(c) - p->iFirst < Prf_ManSize(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                      ,0xea,"void Prf_ManChainResolve(Prf_Man_t *, clause *)");
      }
      iVar1 = clause_id(c);
      pwVar4 = Prf_ManClauseInfo(p,iVar1 - p->iFirst);
      for (local_24 = 0; local_24 < p->nWords; local_24 = local_24 + 1) {
        p->pInfo[local_24] = pwVar4[local_24] | p->pInfo[local_24];
      }
    }
  }
  return;
}

Assistant:

static inline void Prf_ManChainResolve( Prf_Man_t * p, clause * c )
{
    assert( p->iFirst >= 0 );
    assert( p->pInfo != NULL );
    // add to proof info
    if ( c->lrn ) // learned clause
    {
        if ( clause_id(c) >= p->iFirst )
        {
            word * pProofStart;
            int w;
            assert( clause_id(c) - p->iFirst >= 0 );
            assert( clause_id(c) - p->iFirst < Prf_ManSize(p) ); 
            pProofStart = Prf_ManClauseInfo( p, clause_id(c) - p->iFirst );
            for ( w = 0; w < p->nWords; w++ )
                p->pInfo[w] |= pProofStart[w];
        }
    }
    else // problem clause
    {  
        if ( clause_id(c) >= 0 ) // has proof ID
        {
            int Entry;
            if ( p->vId2Pr == NULL )
                Entry = clause_id(c);
            else
                Entry = Vec_IntEntry( p->vId2Pr, clause_id(c) );
            if ( Entry >= 0 )
            {
                assert( Entry < 64 * p->nWords );
                Abc_InfoSetBit( (unsigned *)p->pInfo, Entry );
            }
        }
    }
}